

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  BYTE **ppBVar1;
  U32 UVar2;
  ZSTD_strategy ZVar3;
  HUF_repeat HVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  bool bVar7;
  uint *puVar8;
  seqStore_t *seqStorePtr;
  U32 *workspace;
  symbolEncodingType_e sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  seqStore_t *psVar14;
  size_t sVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  byte *pbVar20;
  size_t sVar21;
  uint uVar22;
  long lVar23;
  size_t unaff_R12;
  ulong uVar24;
  FSE_CTable *pFVar25;
  ZSTD_fseCTables_t *pZVar26;
  byte *pbVar27;
  BYTE *istart;
  ulong uVar28;
  byte *pbVar29;
  bool bVar30;
  size_t workspaceSize;
  uint max;
  BYTE *local_1a0;
  uint *local_198;
  size_t local_190;
  seqStore_t *local_188;
  FSE_CTable *local_180;
  ZSTD_compressedBlockState_t *local_178;
  U32 *local_170;
  ZSTD_compressedBlockState_t *local_168;
  size_t local_160;
  ZSTD_fseCTables_t *local_158;
  symbolEncodingType_e local_14c;
  seqDef *local_148;
  ulong local_140;
  BYTE *local_138;
  BYTE *local_130;
  BYTE *local_128;
  ulong local_120;
  ZSTD_fseCTables_t *local_118;
  seqDef *local_110;
  rawSeqStore_t ldmSeqStore;
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthID = 0;
    pZVar5 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar5->entropy;
    uVar17 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
    UVar2 = (zc->blockState).matchState.nextToUpdate;
    if (UVar2 + 0x180 < uVar17) {
      uVar22 = (uVar17 - UVar2) - 0x180;
      if (0xbf < uVar22) {
        uVar22 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar17 - uVar22;
    }
    iVar19 = 1;
    if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit)
    {
      iVar19 = (uint)((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
    }
    ms = &(zc->blockState).matchState;
    local_188 = &zc->seqStore;
    pZVar6 = (zc->blockState).nextCBlock;
    lVar23 = 0;
    do {
      pZVar6->rep[lVar23] = pZVar5->rep[lVar23];
      lVar23 = lVar23 + 1;
    } while (lVar23 != 3);
    local_198 = (uint *)dst;
    local_190 = dstCapacity;
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      sVar10 = ZSTD_ldm_blockCompress
                         (&zc->externSeqStore,ms,local_188,((zc->blockState).nextCBlock)->rep,src,
                          srcSize);
LAB_0041c967:
      memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - sVar10)),sVar10);
      ppBVar1 = &(zc->seqStore).lit;
      *ppBVar1 = *ppBVar1 + sVar10;
      bVar30 = true;
    }
    else {
      if ((zc->appliedParams).ldmParams.enableLdm == 0) {
        sVar10 = (**(code **)((long)ZSTD_selectBlockCompressor::blockCompressor[0] +
                             (long)(int)(zc->appliedParams).cParams.strategy * 8 +
                             (ulong)(uint)(iVar19 * 0x50)))
                           (ms,local_188,((zc->blockState).nextCBlock)->rep,src);
        goto LAB_0041c967;
      }
      ldmSeqStore.size = 0;
      ldmSeqStore.pos = 0;
      ldmSeqStore.seq = zc->ldmSequences;
      ldmSeqStore.capacity = zc->maxNbLdmSequences;
      unaff_R12 = ZSTD_ldm_generateSequences
                            (&zc->ldmState,&ldmSeqStore,&(zc->appliedParams).ldmParams,src,srcSize);
      if (unaff_R12 < 0xffffffffffffff89) {
        sVar10 = ZSTD_ldm_blockCompress
                           (&ldmSeqStore,ms,local_188,((zc->blockState).nextCBlock)->rep,src,srcSize
                           );
        goto LAB_0041c967;
      }
      bVar30 = false;
    }
    if (!bVar30) {
      return unaff_R12;
    }
    pZVar5 = (zc->blockState).prevCBlock;
    uVar17 = (zc->appliedParams).cParams.windowLog;
    local_178 = (zc->blockState).nextCBlock;
    ZVar3 = (zc->appliedParams).cParams.strategy;
    local_140 = (ulong)ZVar3;
    local_1a0 = (zc->seqStore).litStart;
    uVar24 = (long)(zc->seqStore).lit - (long)local_1a0;
    bVar30 = true;
    if (ZVar3 == ZSTD_fast) {
      bVar30 = (zc->appliedParams).cParams.targetLength == 0;
    }
    local_110 = (zc->seqStore).sequencesStart;
    local_148 = (zc->seqStore).sequences;
    local_170 = zc->entropyWorkspace;
    local_180 = (FSE_CTable *)(ulong)(uint)zc->bmi2;
    local_130 = (zc->seqStore).ofCode;
    bVar16 = 6;
    if (ZSTD_btopt < ZVar3) {
      bVar16 = (char)ZVar3 - 1;
    }
    local_128 = (zc->seqStore).llCode;
    local_138 = (zc->seqStore).mlCode;
    local_160 = srcSize;
    memcpy(local_178,pZVar5,0x404);
    sVar10 = local_160;
    local_168 = pZVar5;
    if (bVar30) {
      uVar28 = 0x3f;
      if ((pZVar5->entropy).huf.repeatMode == HUF_repeat_valid) {
        uVar28 = 6;
      }
      if (uVar28 < uVar24) {
        uVar28 = ((ulong)(0x3ff < uVar24) - (ulong)(uVar24 < 0x4000)) + 4;
        sVar11 = 0xffffffffffffffba;
        sVar21 = local_190 - uVar28;
        if (uVar28 <= local_190 && sVar21 != 0) {
          HVar4 = (pZVar5->entropy).huf.repeatMode;
          ldmSeqStore.seq = (rawSeq *)CONCAT44(ldmSeqStore.seq._4_4_,HVar4);
          bVar30 = uVar24 < 0x401 && (uint)local_140 < 4;
          if (uVar28 == 3 && HVar4 == HUF_repeat_valid || uVar24 < 0x100) {
            uVar12 = HUF_compress1X_repeat
                               ((void *)((long)local_198 + uVar28),sVar21,local_1a0,uVar24,0xff,0xb,
                                local_170,0x1800,(HUF_CElt *)local_178,(HUF_repeat *)&ldmSeqStore,
                                (uint)bVar30,(int)local_180);
          }
          else {
            uVar12 = HUF_compress4X_repeat
                               ((void *)((long)local_198 + uVar28),sVar21,local_1a0,uVar24,0xff,0xb,
                                local_170,0x1800,(HUF_CElt *)local_178,(HUF_repeat *)&ldmSeqStore,
                                (uint)bVar30,(int)local_180);
          }
          uVar22 = 3 - ((int)ldmSeqStore.seq == 0);
          if (uVar12 < (uVar24 - (uVar24 >> (bVar16 & 0x3f))) - 2 && uVar12 - 1 < 0xffffffffffffff88
             ) {
            iVar19 = (int)uVar24;
            if (uVar12 == 1) {
              memcpy(local_178,local_168,0x404);
              lVar23 = ((ulong)(0x1f < uVar24) + 1) - (ulong)(uVar24 < 0x1000);
              lVar13 = lVar23 + 1;
              if (lVar13 == 3) {
                *local_198 = iVar19 << 4 | 0xd;
              }
              else if ((int)lVar13 == 2) {
                *(ushort *)local_198 = (ushort)(iVar19 << 4) | 5;
              }
              else {
                *(char *)local_198 = (char)uVar24 * '\b' + '\x01';
              }
              *(BYTE *)((long)local_198 + lVar13) = *local_1a0;
              sVar11 = (size_t)((int)lVar23 + 2);
            }
            else {
              if ((int)ldmSeqStore.seq == 0) {
                (local_178->entropy).huf.repeatMode = HUF_repeat_check;
              }
              iVar18 = (int)uVar12;
              if (uVar28 == 5) {
                *local_198 = iVar18 * 0x400000 + iVar19 * 0x10 | uVar22 | 0xc;
                *(char *)(local_198 + 1) = (char)(uVar12 >> 10);
              }
              else if (uVar28 == 4) {
                *local_198 = iVar18 * 0x40000 + iVar19 * 0x10 | uVar22 | 8;
              }
              else {
                iVar19 = iVar18 * 0x4000 +
                         ((uVar22 | iVar19 * 0x10 +
                                    (uint)(uVar28 == 3 && HVar4 == HUF_repeat_valid ||
                                          uVar24 < 0x100) * 4) ^ 4);
                *(short *)local_198 = (short)iVar19;
                *(char *)((long)local_198 + 2) = (char)((uint)iVar19 >> 0x10);
              }
              sVar11 = uVar12 + uVar28;
            }
          }
          else {
            memcpy(local_178,local_168,0x404);
            sVar11 = ZSTD_noCompressLiterals(local_198,local_190,local_1a0,uVar24);
          }
        }
      }
      else {
        sVar11 = ZSTD_noCompressLiterals(local_198,local_190,local_1a0,uVar24);
        sVar10 = local_160;
      }
    }
    else {
      sVar11 = ZSTD_noCompressLiterals(local_198,local_190,local_1a0,uVar24);
      sVar10 = local_160;
    }
    pZVar5 = local_178;
    seqStorePtr = local_188;
    sVar21 = local_190;
    puVar8 = local_198;
    psVar14 = (seqStore_t *)sVar11;
    if ((sVar11 < 0xffffffffffffff89) &&
       (psVar14 = (seqStore_t *)0xffffffffffffffba, 3 < (long)(local_190 - sVar11))) {
      uVar24 = (long)local_148 - (long)local_110 >> 3;
      pbVar29 = (byte *)(sVar11 + (long)local_198);
      if (uVar24 < 0x7f) {
        *pbVar29 = (byte)uVar24;
        pbVar29 = pbVar29 + 1;
      }
      else if (uVar24 < 0x7f00) {
        *pbVar29 = (byte)(uVar24 >> 8) | 0x80;
        pbVar29[1] = (byte)uVar24;
        pbVar29 = pbVar29 + 2;
      }
      else {
        *pbVar29 = 0xff;
        *(short *)(pbVar29 + 1) = (short)uVar24 + -0x7f00;
        pbVar29 = pbVar29 + 3;
      }
      local_118 = &(local_178->entropy).fse;
      if (local_148 == local_110) {
        memcpy(local_118,&(local_168->entropy).fse,0xde0);
        psVar14 = (seqStore_t *)((long)pbVar29 - (long)puVar8);
        sVar10 = local_160;
      }
      else {
        local_148 = (seqDef *)(local_178->entropy).fse.litlengthCTable;
        local_1a0 = (BYTE *)((long)local_198 + local_190);
        pbVar20 = pbVar29 + 1;
        local_188 = (seqStore_t *)sVar11;
        ZSTD_seqToCodes(seqStorePtr);
        workspace = local_170;
        max = 0x23;
        sVar11 = 0x41cd9d;
        sVar10 = HIST_countFast_wksp((uint *)&ldmSeqStore,&max,local_128,uVar24,local_170,0x1800);
        (pZVar5->entropy).fse.litlength_repeatMode = (local_168->entropy).fse.litlength_repeatMode;
        pFVar25 = (local_168->entropy).fse.litlengthCTable;
        local_14c = ZSTD_selectEncodingType
                              (&(pZVar5->entropy).fse.litlength_repeatMode,(uint *)&ldmSeqStore,max,
                               sVar10,uVar24,9,pFVar25,LL_defaultNorm,6,ZSTD_defaultAllowed,
                               (ZSTD_strategy)local_140);
        local_180 = (FSE_CTable *)pbVar20;
        psVar14 = (seqStore_t *)
                  ZSTD_buildCTable(pbVar20,(long)local_1a0 - (long)pbVar20,&local_148->offset,9,
                                   local_14c,(uint *)&ldmSeqStore,max,local_128,uVar24,
                                   LL_defaultNorm,6,0x23,pFVar25,0x524,workspace,sVar11);
        pZVar5 = local_168;
        sVar21 = local_190;
        sVar10 = local_160;
        if (psVar14 < 0xffffffffffffff89) {
          pbVar20 = (byte *)((long)local_180 + (long)psVar14);
          local_158 = &(local_168->entropy).fse;
          max = 0x1f;
          sVar11 = 0x41cecb;
          sVar10 = HIST_countFast_wksp((uint *)&ldmSeqStore,&max,local_130,uVar24,local_170,0x1800);
          pZVar26 = local_158;
          (local_178->entropy).fse.offcode_repeatMode = (pZVar5->entropy).fse.offcode_repeatMode;
          sVar9 = ZSTD_selectEncodingType
                            (&(local_178->entropy).fse.offcode_repeatMode,(uint *)&ldmSeqStore,max,
                             sVar10,uVar24,8,local_158->offcodeCTable,OF_defaultNorm,5,
                             (uint)(max < 0x1d),(ZSTD_strategy)local_140);
          local_120 = (ulong)sVar9;
          psVar14 = (seqStore_t *)
                    ZSTD_buildCTable(pbVar20,(long)local_1a0 - (long)pbVar20,
                                     local_118->offcodeCTable,8,sVar9,(uint *)&ldmSeqStore,max,
                                     local_130,uVar24,OF_defaultNorm,5,0x1c,pZVar26->offcodeCTable,
                                     0x304,local_170,sVar11);
          pZVar5 = local_178;
          sVar21 = local_190;
          sVar10 = local_160;
          if (psVar14 < 0xffffffffffffff89) {
            local_158 = (ZSTD_fseCTables_t *)(pbVar20 + (long)psVar14);
            if (local_14c != set_compressed) {
              local_180 = (FSE_CTable *)(byte *)0x0;
            }
            pbVar27 = (byte *)local_180;
            if ((int)local_120 == 2) {
              pbVar27 = pbVar20;
            }
            local_180 = (local_178->entropy).fse.matchlengthCTable;
            max = 0x34;
            workspaceSize = 0x41d011;
            sVar10 = HIST_countFast_wksp((uint *)&ldmSeqStore,&max,local_138,uVar24,local_170,0x1800
                                        );
            (pZVar5->entropy).fse.matchlength_repeatMode =
                 (local_168->entropy).fse.matchlength_repeatMode;
            pFVar25 = (local_168->entropy).fse.matchlengthCTable;
            sVar9 = ZSTD_selectEncodingType
                              (&(pZVar5->entropy).fse.matchlength_repeatMode,(uint *)&ldmSeqStore,
                               max,sVar10,uVar24,9,pFVar25,ML_defaultNorm,6,ZSTD_defaultAllowed,
                               (ZSTD_strategy)local_140);
            sVar15 = ZSTD_buildCTable(local_158,(long)local_1a0 - (long)local_158,local_180,9,sVar9,
                                      (uint *)&ldmSeqStore,max,local_138,uVar24,ML_defaultNorm,6,
                                      0x34,pFVar25,0x5ac,local_170,workspaceSize);
            pZVar26 = local_158;
            sVar11 = sVar15;
            if (0xffffffffffffff88 < sVar15) {
              local_188 = (seqStore_t *)sVar15;
              pZVar26 = (ZSTD_fseCTables_t *)pbVar27;
              sVar11 = 0;
            }
            if (sVar9 != set_compressed) {
              pZVar26 = (ZSTD_fseCTables_t *)pbVar27;
            }
            psVar14 = local_188;
            sVar21 = local_190;
            sVar10 = local_160;
            if (sVar15 < 0xffffffffffffff89) {
              pbVar20 = (byte *)((long)local_158 + sVar11);
              *pbVar29 = (char)((int)local_120 << 4) + (char)(local_14c << 6) + (char)sVar9 * '\x04'
              ;
              psVar14 = (seqStore_t *)
                        ZSTD_encodeSequences
                                  (pbVar20,(long)local_1a0 - (long)pbVar20,local_180,local_138,
                                   local_118->offcodeCTable,local_130,&local_148->offset,local_128,
                                   local_110,uVar24,(uint)(0x39 < uVar17),(int)workspaceSize);
              if (psVar14 < 0xffffffffffffff89) {
                pbVar20 = pbVar20 + (long)psVar14;
                bVar7 = 3 < (long)pbVar20 - (long)pZVar26;
                bVar30 = bVar7 || pZVar26 == (ZSTD_fseCTables_t *)0x0;
                psVar14 = (seqStore_t *)0;
                if (bVar7 || pZVar26 == (ZSTD_fseCTables_t *)0x0) {
                  psVar14 = local_188;
                }
              }
              else {
                bVar30 = false;
              }
              sVar21 = local_190;
              sVar10 = local_160;
              if (bVar30) {
                psVar14 = (seqStore_t *)((long)pbVar20 - (long)local_198);
              }
            }
          }
        }
      }
    }
    if ((psVar14 != (seqStore_t *)0x0) &&
       ((sVar21 < sVar10 || (psVar14 != (seqStore_t *)0xffffffffffffffba)))) {
      if (psVar14 < 0xffffffffffffff89) {
        ZVar3 = (zc->appliedParams).cParams.strategy;
        bVar16 = 6;
        if (ZSTD_btopt < ZVar3) {
          bVar16 = (char)ZVar3 - 1;
        }
        if ((sVar10 - (sVar10 >> (bVar16 & 0x3f))) - 2 <= psVar14) {
          psVar14 = (seqStore_t *)0;
        }
      }
      goto LAB_0041c74f;
    }
  }
  psVar14 = (seqStore_t *)0;
LAB_0041c74f:
  if ((long)psVar14 - 1U < 0xffffffffffffff88) {
    pZVar5 = (zc->blockState).prevCBlock;
    (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
    (zc->blockState).nextCBlock = pZVar5;
  }
  pZVar5 = (zc->blockState).prevCBlock;
  if ((pZVar5->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar5->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return (size_t)psVar14;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    size_t cSize;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)ms->window.dictLimit, (unsigned)ms->nextToUpdate);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);

    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        cSize = 0;
        goto out;  /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;   /* required for optimal parser to read stats from dictionary */

    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            CHECK_F(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    cSize = ZSTD_compressSequences(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

out:
    if (!ZSTD_isError(cSize) && cSize != 0) {
        /* confirm repcodes and entropy tables when emitting a compressed block */
        ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
        zc->blockState.prevCBlock = zc->blockState.nextCBlock;
        zc->blockState.nextCBlock = tmp;
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}